

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_2misc_64(DisasContext_conflict1 *s,int opcode,_Bool u,TCGv_i64 tcg_rd,TCGv_i64 tcg_rn,
                    TCGv_i32 tcg_rmode,TCGv_ptr tcg_fpstatus)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i32 tcg_shift_1;
  TCGv_i32 tcg_shift;
  TCGCond cond;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 tcg_rmode_local;
  TCGv_i64 tcg_rn_local;
  TCGv_i64 tcg_rd_local;
  _Bool u_local;
  int opcode_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (0x7a < opcode - 4U && opcode != 0x7f) {
LAB_00841d35:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x2638,(char *)0x0);
  }
  switch((long)&switchD_00841af3::switchdataD_0137cdb4 +
         (long)(int)(&switchD_00841af3::switchdataD_0137cdb4)[opcode - 4U]) {
  case 0x841af5:
    if (u) {
      tcg_gen_clzi_i64_aarch64(tcg_ctx_00,tcg_rd,tcg_rn,0x40);
    }
    else {
      tcg_gen_clrsb_i64_aarch64(tcg_ctx_00,tcg_rd,tcg_rn);
    }
    break;
  case 0x841b29:
    tcg_gen_not_i64_aarch64(tcg_ctx_00,tcg_rd,tcg_rn);
    break;
  case 0x841b3f:
    if (u) {
      gen_helper_neon_qneg_s64(tcg_ctx_00,tcg_rd,tcg_ctx_00->cpu_env,tcg_rn);
    }
    else {
      gen_helper_neon_qabs_s64(tcg_ctx_00,tcg_rd,tcg_ctx_00->cpu_env,tcg_rn);
    }
    break;
  case 0x841b84:
    tcg_shift._4_4_ = TCG_COND_LT;
LAB_00841b8b:
    tcg_gen_setcondi_i64_aarch64(tcg_ctx_00,tcg_shift._4_4_,tcg_rd,tcg_rn,0);
    tcg_gen_neg_i64(tcg_ctx_00,tcg_rd,tcg_rd);
    break;
  case 0x841bba:
    tcg_shift._4_4_ = TCG_COND_GT;
    if (u) {
      tcg_shift._4_4_ = TCG_COND_GE;
    }
    goto LAB_00841b8b;
  case 0x841bd2:
    tcg_shift._4_4_ = TCG_COND_EQ;
    if (u) {
      tcg_shift._4_4_ = TCG_COND_LE;
    }
    goto LAB_00841b8b;
  case 0x841bea:
    if (u) {
      tcg_gen_neg_i64(tcg_ctx_00,tcg_rd,tcg_rn);
    }
    else {
      tcg_gen_abs_i64_aarch64(tcg_ctx_00,tcg_rd,tcg_rn);
    }
    break;
  case 0x841c19:
    gen_helper_vfp_absd(tcg_ctx_00,tcg_rd,tcg_rn);
    break;
  case 0x841c2f:
    gen_helper_vfp_negd(tcg_ctx_00,tcg_rd,tcg_rn);
    break;
  case 0x841c45:
    gen_helper_vfp_sqrtd(tcg_ctx_00,tcg_rd,tcg_rn,tcg_ctx_00->cpu_env);
    break;
  case 0x841c66:
    pTVar1 = tcg_const_i32_aarch64(tcg_ctx_00,0);
    gen_helper_vfp_tosqd(tcg_ctx_00,tcg_rd,tcg_rn,pTVar1,tcg_fpstatus);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    break;
  case 0x841ca0:
    pTVar1 = tcg_const_i32_aarch64(tcg_ctx_00,0);
    gen_helper_vfp_touqd(tcg_ctx_00,tcg_rd,tcg_rn,pTVar1,tcg_fpstatus);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    break;
  case 0x841cd7:
    gen_helper_rintd(tcg_ctx_00,tcg_rd,tcg_rn,tcg_fpstatus);
    break;
  case 0x841cee:
    gen_helper_rintd_exact(tcg_ctx_00,tcg_rd,tcg_rn,tcg_fpstatus);
    break;
  case 0x841d05:
    gen_helper_frint32_d(tcg_ctx_00,tcg_rd,tcg_rn,tcg_fpstatus);
    break;
  case 0x841d1c:
    gen_helper_frint64_d(tcg_ctx_00,tcg_rd,tcg_rn,tcg_fpstatus);
    break;
  case 0x841d33:
    goto LAB_00841d35;
  }
  return;
}

Assistant:

static void handle_2misc_64(DisasContext *s, int opcode, bool u,
                            TCGv_i64 tcg_rd, TCGv_i64 tcg_rn,
                            TCGv_i32 tcg_rmode, TCGv_ptr tcg_fpstatus)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Handle 64->64 opcodes which are shared between the scalar and
     * vector 2-reg-misc groups. We cover every integer opcode where size == 3
     * is valid in either group and also the double-precision fp ops.
     * The caller only need provide tcg_rmode and tcg_fpstatus if the op
     * requires them.
     */
    TCGCond cond;

    switch (opcode) {
    case 0x4: /* CLS, CLZ */
        if (u) {
            tcg_gen_clzi_i64(tcg_ctx, tcg_rd, tcg_rn, 64);
        } else {
            tcg_gen_clrsb_i64(tcg_ctx, tcg_rd, tcg_rn);
        }
        break;
    case 0x5: /* NOT */
        /* This opcode is shared with CNT and RBIT but we have earlier
         * enforced that size == 3 if and only if this is the NOT insn.
         */
        tcg_gen_not_i64(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x7: /* SQABS, SQNEG */
        if (u) {
            gen_helper_neon_qneg_s64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
        } else {
            gen_helper_neon_qabs_s64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
        }
        break;
    case 0xa: /* CMLT */
        /* 64 bit integer comparison against zero, result is
         * test ? (2^64 - 1) : 0. We implement via setcond(!test) and
         * subtracting 1.
         */
        cond = TCG_COND_LT;
    do_cmop:
        tcg_gen_setcondi_i64(tcg_ctx, cond, tcg_rd, tcg_rn, 0);
        tcg_gen_neg_i64(tcg_ctx, tcg_rd, tcg_rd);
        break;
    case 0x8: /* CMGT, CMGE */
        cond = u ? TCG_COND_GE : TCG_COND_GT;
        goto do_cmop;
    case 0x9: /* CMEQ, CMLE */
        cond = u ? TCG_COND_LE : TCG_COND_EQ;
        goto do_cmop;
    case 0xb: /* ABS, NEG */
        if (u) {
            tcg_gen_neg_i64(tcg_ctx, tcg_rd, tcg_rn);
        } else {
            tcg_gen_abs_i64(tcg_ctx, tcg_rd, tcg_rn);
        }
        break;
    case 0x2f: /* FABS */
        gen_helper_vfp_absd(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x6f: /* FNEG */
        gen_helper_vfp_negd(tcg_ctx, tcg_rd, tcg_rn);
        break;
    case 0x7f: /* FSQRT */
        gen_helper_vfp_sqrtd(tcg_ctx, tcg_rd, tcg_rn, tcg_ctx->cpu_env);
        break;
    case 0x1a: /* FCVTNS */
    case 0x1b: /* FCVTMS */
    case 0x1c: /* FCVTAS */
    case 0x3a: /* FCVTPS */
    case 0x3b: /* FCVTZS */
    {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
        gen_helper_vfp_tosqd(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_shift);
        break;
    }
    case 0x5a: /* FCVTNU */
    case 0x5b: /* FCVTMU */
    case 0x5c: /* FCVTAU */
    case 0x7a: /* FCVTPU */
    case 0x7b: /* FCVTZU */
    {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
        gen_helper_vfp_touqd(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_shift);
        break;
    }
    case 0x18: /* FRINTN */
    case 0x19: /* FRINTM */
    case 0x38: /* FRINTP */
    case 0x39: /* FRINTZ */
    case 0x58: /* FRINTA */
    case 0x79: /* FRINTI */
        gen_helper_rintd(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x59: /* FRINTX */
        gen_helper_rintd_exact(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x1e: /* FRINT32Z */
    case 0x5e: /* FRINT32X */
        gen_helper_frint32_d(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    case 0x1f: /* FRINT64Z */
    case 0x5f: /* FRINT64X */
        gen_helper_frint64_d(tcg_ctx, tcg_rd, tcg_rn, tcg_fpstatus);
        break;
    default:
        g_assert_not_reached();
    }
}